

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiWindow * FindFrontMostVisibleChildWindow(ImGuiWindow *window)

{
  ImGuiWindowTempData *pIVar1;
  ImGuiWindow *pIVar2;
  long lVar3;
  ImGuiWindow *in_RDI;
  
  do {
    pIVar2 = in_RDI;
    lVar3 = (long)(in_RDI->DC).ChildWindows.Size;
    if (lVar3 < 1) {
      return pIVar2;
    }
    pIVar1 = &in_RDI->DC;
    lVar3 = lVar3 + 1;
    while ((in_RDI = (pIVar1->ChildWindows).Data[lVar3 + -2], in_RDI->Active != true ||
           (in_RDI->Hidden == true))) {
      lVar3 = lVar3 + -1;
      if (lVar3 < 2) {
        return pIVar2;
      }
    }
  } while( true );
}

Assistant:

static ImGuiWindow* FindFrontMostVisibleChildWindow(ImGuiWindow* window)
{
    for (int n = window->DC.ChildWindows.Size - 1; n >= 0; n--)
        if (IsWindowActiveAndVisible(window->DC.ChildWindows[n]))
            return FindFrontMostVisibleChildWindow(window->DC.ChildWindows[n]);
    return window;
}